

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::verifyImage
          (SampleMaskWriteCase *this,Surface *resultImage)

{
  int iVar1;
  bool bVar2;
  RenderTarget *pRVar3;
  long lVar4;
  TestLog *log;
  Verifier local_38;
  RGBA local_30;
  undefined4 auStack_2c [3];
  Vec4 local_20;
  
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    bVar2 = true;
    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        m_renderTarget == TARGET_DEFAULT) {
      pRVar3 = Context::getRenderTarget
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.m_context);
      bVar2 = pRVar3->m_numSamples < 2;
    }
  }
  else {
    bVar2 = false;
  }
  iVar1 = *(int *)&(this->super_SampleMaskBaseCase).field_0x12c;
  if (iVar1 == 1) {
    log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
           super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    if (bVar2) {
      local_38._vptr_Verifier = (_func_int **)&PTR_verify_00b486d0;
      local_20.m_data[0] = 0.0;
      local_20.m_data[1] = 1.0;
      local_20.m_data[2] = 0.0;
      local_20.m_data[3] = 1.0;
      tcu::RGBA::RGBA(&local_30,&local_20);
      lVar4 = 3;
      do {
        *(undefined4 *)((long)&local_38._vptr_Verifier + lVar4 * 4) = 8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
    }
    else {
      local_38._vptr_Verifier = (_func_int **)&PTR_verify_00b486d0;
      local_20.m_data[0] = 0.0;
      local_20.m_data[1] = 0.0;
      local_20.m_data[2] = 0.0;
      local_20.m_data[3] = 1.0;
      tcu::RGBA::RGBA(&local_30,&local_20);
      lVar4 = 3;
      do {
        *(undefined4 *)((long)&local_38._vptr_Verifier + lVar4 * 4) = 8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
    }
  }
  else {
    if (iVar1 != 0) {
      return false;
    }
    if (bVar2) {
      log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
            m_log;
      local_38._vptr_Verifier = (_func_int **)&PTR_verify_00b486d0;
      local_20.m_data[0] = 0.0;
      local_20.m_data[1] = 1.0;
      local_20.m_data[2] = 0.0;
      local_20.m_data[3] = 1.0;
      tcu::RGBA::RGBA(&local_30,&local_20);
      lVar4 = 3;
      do {
        *(undefined4 *)((long)&local_38._vptr_Verifier + lVar4 * 4) = 8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
    }
    else {
      log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
            m_log;
      if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          m_numTargetSamples == 1) {
        local_38._vptr_Verifier = (_func_int **)&PTR_verify_00b486d0;
        local_20.m_data[0] = 0.0;
        local_20.m_data[1] = 0.0;
        local_20.m_data[2] = 0.0;
        local_20.m_data[3] = 1.0;
        tcu::RGBA::RGBA(&local_30,&local_20);
        lVar4 = 3;
        do {
          *(undefined4 *)((long)&local_38._vptr_Verifier + lVar4 * 4) = 8;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 6);
      }
      else {
        local_38._vptr_Verifier = (_func_int **)&PTR_verify_00b48c40;
      }
    }
  }
  bVar2 = verifyImageWithVerifier(resultImage,log,&local_38,true);
  return bVar2;
}

Assistant:

bool SampleMaskWriteCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool singleSampleTarget = m_numRequestedSamples == 0 && !(m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() > 1);

	if (m_testMode == TEST_DISCARD)
	{
		if (singleSampleTarget)
		{
			// single sample case => multisample operations are not effective => don't discard anything
			// expect green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 1.0f, 0.0f)));
		}
		else if (m_numTargetSamples == 1)
		{
			// total discard, expect black
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f)));
		}
		else
		{
			// partial discard, expect something between black and green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), PartialDiscardVerifier());
		}
	}
	else if (m_testMode == TEST_INVERSE)
	{
		if (singleSampleTarget)
		{
			// single sample case => multisample operations are not effective => don't discard anything
			// expect green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 1.0f, 0.0f)));
		}
		else
		{
			// total discard, expect black
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f)));
		}
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}